

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

uint32_t __thiscall Catch::TestCaseInfoHasher::operator()(TestCaseInfoHasher *this,TestCaseInfo *t)

{
  bool bVar1;
  reference pcVar2;
  StringRef *this_00;
  const_iterator pcVar3;
  long lVar4;
  long in_RSI;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  *in_RDI;
  uint32_t high;
  uint32_t low;
  char c_2;
  const_iterator __end2;
  const_iterator __begin2;
  StringRef *__range2;
  Tag *tag;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1_2;
  char c_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  StringRef *__range1_1;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  hash_t hash;
  hash_t prime;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *in_stack_ffffffffffffff48;
  char *local_90;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_70;
  long local_68;
  char local_59;
  const_iterator local_58;
  char *local_50;
  StringRef *local_48;
  char local_39;
  undefined8 local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [2];
  ulong local_20;
  undefined8 local_18;
  long local_10;
  
  local_18 = 0x100000001b3;
  local_20 = 0xcbf29ce484222325;
  local_10 = in_RSI;
  local_30[0]._M_current = (char *)std::__cxx11::string::begin();
  local_38 = std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_30);
    local_39 = *pcVar2;
    local_20 = ((long)local_39 ^ local_20) * 0x100000001b3;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  }
  local_48 = (StringRef *)(local_10 + 0x20);
  local_50 = StringRef::begin(local_48);
  local_58 = StringRef::end(local_48);
  for (; local_50 != local_58; local_50 = local_50 + 1) {
    local_59 = *local_50;
    local_20 = ((long)local_59 ^ local_20) * 0x100000001b3;
  }
  local_68 = local_10 + 0x50;
  local_70._M_current =
       (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(in_stack_ffffffffffffff48)
  ;
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                               *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
               ::operator*(&local_70)->original;
    local_90 = StringRef::begin(this_00);
    pcVar3 = StringRef::end(this_00);
    for (; local_90 != pcVar3; local_90 = local_90 + 1) {
      local_20 = ((long)*local_90 ^ local_20) * 0x100000001b3;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&local_70);
  }
  lVar4 = ((ulong)in_RDI->_M_current ^ local_20) * 0x100000001b3;
  return (int)lVar4 * (int)((ulong)lVar4 >> 0x20);
}

Assistant:

uint32_t TestCaseInfoHasher::operator()( TestCaseInfo const& t ) const {
        // FNV-1a hash algorithm that is designed for uniqueness:
        const hash_t prime = 1099511628211u;
        hash_t hash = 14695981039346656037u;
        for ( const char c : t.name ) {
            hash ^= c;
            hash *= prime;
        }
        for ( const char c : t.className ) {
            hash ^= c;
            hash *= prime;
        }
        for ( const Tag& tag : t.tags ) {
            for ( const char c : tag.original ) {
                hash ^= c;
                hash *= prime;
            }
        }
        hash ^= m_seed;
        hash *= prime;
        const uint32_t low{ static_cast<uint32_t>( hash ) };
        const uint32_t high{ static_cast<uint32_t>( hash >> 32 ) };
        return low * high;
    }